

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O1

void print_ast_node_list(TextBuffer *buf,AstNodeList *list,int level,char *delimiter)

{
  bool bVar1;
  bool bVar2;
  AstNode *node;
  undefined4 in_register_00000014;
  PtrListIterator nodeiter__;
  PtrListIterator local_48;
  
  raviX_ptrlist_forward_iterator(&local_48,(PtrList *)list);
  node = (AstNode *)raviX_ptrlist_iter_next(&local_48);
  if (node != (AstNode *)0x0) {
    bVar2 = true;
    do {
      bVar1 = bVar2;
      if (bVar2) {
        bVar1 = false;
      }
      if (!(bool)(delimiter == (char *)0x0 | bVar2)) {
        printf_buf(buf,"%p%s\n",CONCAT44(in_register_00000014,level),delimiter);
        bVar1 = bVar2;
      }
      raviX_print_ast_node(buf,node,level + 1);
      node = (AstNode *)raviX_ptrlist_iter_next(&local_48);
      bVar2 = bVar1;
    } while (node != (AstNode *)0x0);
  }
  return;
}

Assistant:

static void print_ast_node_list(TextBuffer *buf, AstNodeList *list, int level, const char *delimiter)
{
	AstNode *node;
	bool is_first = true;
	FOR_EACH_PTR(list, AstNode, node)
	{
		if (is_first)
			is_first = false;
		else if (delimiter)
			printf_buf(buf, "%p%s\n", level, delimiter);
		raviX_print_ast_node(buf, node, level + 1);
	}
	END_FOR_EACH_PTR(node);
}